

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::CompressedCubeFormatCase::iterate(CompressedCubeFormatCase *this)

{
  bool bVar1;
  char *description;
  CompressedCubeFormatCase *this_local;
  
  bVar1 = testFace(this,this->m_curFace);
  if (!bVar1) {
    this->m_isOk = false;
  }
  this->m_curFace = this->m_curFace + 1;
  if (this->m_curFace == 6) {
    description = "Image comparison failed";
    if ((this->m_isOk & 1U) != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,(uint)((this->m_isOk & 1U) == 0),
               description);
    this_local._4_4_ = STOP;
  }
  else {
    this_local._4_4_ = CONTINUE;
  }
  return this_local._4_4_;
}

Assistant:

CompressedCubeFormatCase::IterateResult CompressedCubeFormatCase::iterate (void)
{
	// Execute test for all faces.
	if (!testFace((tcu::CubeFace)m_curFace))
		m_isOk = false;

	m_curFace += 1;

	if (m_curFace == tcu::CUBEFACE_LAST)
	{
		m_testCtx.setTestResult(m_isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								m_isOk ? "Pass"					: "Image comparison failed");
		return STOP;
	}
	else
		return CONTINUE;
}